

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O2

bool __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::Run
          (InfiniteImpulseResponseDigitalFilter *this,double input,double *output,Buffer *buffer)

{
  pointer pdVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  int iVar6;
  int iVar7;
  pointer pdVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  
  bVar9 = (bool)(buffer != (Buffer *)0x0 & output != (double *)0x0 & this->is_valid_);
  if (bVar9 == true) {
    pdVar5 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = this->num_filter_order_;
    if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar5 >> 3 == (long)iVar7 + 1U) {
      iVar6 = buffer->p_;
    }
    else {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,(long)iVar7 + 1U);
      pdVar1 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar5 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pdVar8 = pdVar5; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
        *pdVar8 = 0.0;
      }
      buffer->p_ = 0;
      iVar7 = this->num_filter_order_;
      iVar6 = 0;
    }
    pdVar2 = (this->denominator_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar14 = -input * *pdVar2;
    uVar11 = 0;
    iVar13 = iVar6;
    uVar10 = (ulong)(uint)this->num_denominator_order_;
    if (this->num_denominator_order_ < 1) {
      uVar10 = uVar11;
    }
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      iVar4 = iVar13 + -1;
      if (iVar13 < 1) {
        iVar4 = iVar7;
      }
      dVar14 = dVar14 + pdVar5[iVar4] * pdVar2[uVar11 + 1];
      iVar13 = iVar4;
    }
    pdVar5[iVar6] = -dVar14;
    iVar7 = this->num_filter_order_;
    dVar14 = 0.0;
    iVar13 = iVar6 + 1;
    for (lVar12 = 0; lVar12 <= this->num_numerator_order_; lVar12 = lVar12 + 1) {
      bVar3 = iVar13 < 1;
      iVar13 = iVar13 + -1;
      if (bVar3) {
        iVar13 = iVar7;
      }
      dVar14 = dVar14 + pdVar5[iVar13] *
                        (this->numerator_coefficients_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12];
    }
    *output = dVar14;
    iVar13 = 0;
    if (iVar6 < iVar7) {
      iVar13 = iVar6 + 1;
    }
    buffer->p_ = iVar13;
  }
  return bVar9;
}

Assistant:

bool InfiniteImpulseResponseDigitalFilter::Run(
    double input, double* output,
    InfiniteImpulseResponseDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d_.resize(num_filter_order_ + 1);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
    buffer->p_ = 0;
  }

  double* d(&buffer->d_[0]);

  {
    const double* a(&(denominator_coefficients_[0]));
    double x(-input * a[0]);
    for (int i(1), p(buffer->p_); i <= num_denominator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      x += d[p] * a[i];
    }
    d[buffer->p_] = -x;
  }

  {
    const double* b(&(numerator_coefficients_[0]));
    double y(0.0);
    for (int i(0), p(buffer->p_ + 1); i <= num_numerator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      y += d[p] * b[i];
    }
    *output = y;
  }

  // Update pointer of ring buffer.
  ++(buffer->p_);
  if (num_filter_order_ < buffer->p_) {
    buffer->p_ = 0;
  }

  return true;
}